

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O1

int __thiscall
anon_unknown.dwarf_b88dc9::RateRepresentationPredicate::Rate
          (RateRepresentationPredicate *this,IfcRepresentation *r)

{
  int iVar1;
  uint uVar2;
  IfcRepresentationItem *pIVar3;
  ulong uVar4;
  IfcRepresentationMap *pIVar5;
  Object *pOVar6;
  RateRepresentationPredicate *pRVar7;
  pointer_____offset_0x10___ *r_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar9;
  ulong uVar8;
  
  if (this[0x38] != (RateRepresentationPredicate)0x1) {
    return 0;
  }
  uVar9 = 0;
  pRVar7 = this + 0x18;
  iVar1 = std::__cxx11::string::compare((char *)pRVar7);
  if (iVar1 == 0) {
    if (*(undefined8 **)(this + 0x68) != *(undefined8 **)(this + 0x70)) {
      pIVar3 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcRepresentationItem>
                         ((LazyObject *)**(undefined8 **)(this + 0x68));
      uVar4 = __dynamic_cast((_func_int *)
                             ((long)&(pIVar3->
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                     )._vptr_ObjectHelper +
                             (long)(pIVar3->
                                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                   )._vptr_ObjectHelper[-3]),&Assimp::STEP::Object::typeinfo,
                             &Assimp::IFC::Schema_2x3::IfcMappedItem::typeinfo,0xffffffffffffffff,
                             in_R8,in_R9,uVar9);
      uVar8 = uVar4;
      if (uVar4 != 0) {
        pIVar5 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcRepresentationMap>
                           (*(LazyObject **)(uVar4 + 0x20));
        pOVar6 = Assimp::STEP::LazyObject::operator*
                           (*(LazyObject **)
                             &(pIVar5->
                              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationMap,_2UL>
                              ).field_0x20);
        r_00 = &Assimp::STEP::Object::typeinfo;
        pRVar7 = (RateRepresentationPredicate *)
                 __dynamic_cast(pOVar6,&Assimp::STEP::Object::typeinfo,
                                &Assimp::IFC::Schema_2x3::IfcRepresentation::typeinfo,
                                0xffffffffffffffff);
        uVar2 = Rate(pRVar7,(IfcRepresentation *)r_00);
        uVar8 = (ulong)uVar2;
      }
      if (uVar4 != 0) {
        return (int)uVar8;
      }
    }
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)pRVar7);
    if (iVar1 == 0) {
      return -3;
    }
    iVar1 = std::__cxx11::string::compare((char *)pRVar7);
    if (iVar1 == 0) {
      return -10;
    }
    iVar1 = std::__cxx11::string::compare((char *)pRVar7);
    if (iVar1 == 0) {
      return -5;
    }
    iVar1 = std::__cxx11::string::compare((char *)pRVar7);
    if (iVar1 == 0) {
      return -2;
    }
    iVar1 = std::__cxx11::string::compare((char *)pRVar7);
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)pRVar7);
      if (iVar1 == 0) {
        return 100;
      }
      return 0;
    }
  }
  return 100;
}

Assistant:

int Rate(const Schema_2x3::IfcRepresentation* r) const {
        // the smaller, the better

        if (! r->RepresentationIdentifier) {
            // neutral choice if no extra information is specified
            return 0;
        }


        const std::string& name = r->RepresentationIdentifier.Get();
        if (name == "MappedRepresentation") {
            if (!r->Items.empty()) {
                // take the first item and base our choice on it
                const Schema_2x3::IfcMappedItem* const m = r->Items.front()->ToPtr<Schema_2x3::IfcMappedItem>();
                if (m) {
                    return Rate(m->MappingSource->MappedRepresentation);
                }
            }
            return 100;
        }

        return Rate(name);
    }